

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

bool __thiscall Clasp::mt::SharedLitsClause::simplify(SharedLitsClause *this,Solver *s,bool reinit)

{
  uint uVar1;
  uint uVar2;
  SharedLiterals *pSVar3;
  pointer puVar4;
  bool bVar5;
  uint32 uVar6;
  int iVar7;
  Literal *pLVar8;
  ulong uVar9;
  Literal *pLVar10;
  uint *puVar11;
  SharedLiterals *pSVar12;
  Literal lits [5];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  ClauseRep local_40;
  
  puVar11 = (uint *)&local_58;
  bVar5 = ClauseHead::satisfied(&this->super_ClauseHead,s);
  if ((bVar5) ||
     (uVar6 = SharedLiterals::simplify((this->super_ClauseHead).field_0.shared_,s), uVar6 == 0)) {
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x12])(this,s);
    return true;
  }
  if (uVar6 < 6) {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    pSVar3 = (this->super_ClauseHead).field_0.shared_;
    uVar1 = pSVar3->size_type_;
    puVar4 = (s->assign_).assign_.ebo_.buf;
    for (uVar9 = 0; (uVar1 & 0xfffffffc) != uVar9; uVar9 = uVar9 + 4) {
      uVar2 = *(uint *)((long)&pSVar3[1].refCount_.super___atomic_base<int>._M_i + uVar9);
      if ((byte)(*(byte *)((long)puVar4 + (ulong)(uVar2 & 0xfffffffc)) & 3) !=
          (byte)(((uVar2 & 2) == 0) + 1U)) {
        *puVar11 = uVar2;
        puVar11 = puVar11 + 1;
      }
    }
    uVar1 = (this->super_ClauseHead).info_.super_ConstraintScore.rep;
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x12])(this);
    destroy(this,(Solver *)0x0,false);
    local_40._0_8_ =
         ((long)puVar11 - (long)&local_58) * 0x40000000 & 0x7fffffff00000000U | (ulong)uVar1 |
         0x8000000000000000;
    local_40.lits = (Literal *)&local_58;
    Clause::newClause(this,s,&local_40);
    iVar7 = (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[4])(this,s,(ulong)reinit);
    return (bool)(char)iVar7;
  }
  uVar1 = (this->super_ClauseHead).head_[2].rep_;
  if ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3) ==
      (byte)(((uVar1 & 2) == 0) + 1U)) {
    pSVar3 = (this->super_ClauseHead).field_0.shared_;
    pLVar10 = (this->super_ClauseHead).head_ + 2;
    pSVar12 = pSVar3 + 1;
    uVar9 = (ulong)(pSVar3->size_type_ & 0xfffffffc);
    while( true ) {
      if (uVar9 == 0) {
        return false;
      }
      uVar1 = (pSVar12->refCount_).super___atomic_base<int>._M_i;
      if (((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3)
           != (byte)(((uVar1 & 2) == 0) + 1U)) &&
         (pLVar8 = std::
                   __find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Literal_const>>
                             ((this->super_ClauseHead).head_,pLVar10,pSVar12), pLVar8 == pLVar10))
      break;
      pSVar12 = (SharedLiterals *)&pSVar12->size_type_;
      uVar9 = uVar9 - 4;
    }
    pLVar10->rep_ = (pSVar12->refCount_).super___atomic_base<int>._M_i;
    return false;
  }
  return false;
}

Assistant:

bool SharedLitsClause::simplify(Solver& s, bool reinit) {
	if (ClauseHead::satisfied(s)) {
		detach(s);
		return true;
	}
	uint32 optSize = shared_->simplify(s);
	if (optSize == 0) {
		detach(s);
		return true;
	}
	else if (optSize <= Clause::MAX_SHORT_LEN) {
		Literal lits[Clause::MAX_SHORT_LEN];
		Literal* j = lits;
		for (const Literal* r = shared_->begin(), *e = shared_->end(); r != e; ++r) {
			if (!s.isFalse(*r)) *j++ = *r;
		}
		// safe extra data
		InfoType myInfo = info_;
		// detach & destroy but do not release memory
		detach(s);
		SharedLitsClause::destroy(0, false);
		// construct short clause in "this"
		ClauseHead* h = Clause::newClause(this, s, ClauseRep::prepared(lits, static_cast<uint32>(j-lits), myInfo));
		return h->simplify(s, reinit);
	}
	else if (s.isFalse(head_[2])) {
		// try to replace cache lit with non-false literal
		for (const Literal* r = shared_->begin(), *e = shared_->end(); r != e; ++r) {
			if (!s.isFalse(*r) && std::find(head_, head_+2, *r) == head_+2) {
				head_[2] = *r;
				break;
			}
		}
	}
	return false;
}